

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_ecmult_multi(secp256k1_scratch *scratch,secp256k1_ecmult_multi_func ecmult_multi)

{
  ulong uVar1;
  size_t sVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  secp256k1_gej *psVar16;
  secp256k1_gej *psVar17;
  secp256k1_ge *psVar18;
  uint64_t *puVar19;
  secp256k1_ge *psVar20;
  uint64_t *puVar21;
  char *pcVar22;
  long lVar23;
  uint uVar24;
  secp256k1_scalar *psVar25;
  ulong uVar26;
  int iVar27;
  byte bVar28;
  ecmult_multi_data data;
  secp256k1_gej r;
  secp256k1_gej ptgj;
  secp256k1_scalar t1;
  secp256k1_scalar t0;
  secp256k1_scalar local_14d8;
  secp256k1_scalar local_14b8;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  secp256k1_gej r2;
  secp256k1_scalar tmp2;
  secp256k1_scalar tmp1;
  secp256k1_ge ptg;
  secp256k1_scalar rs;
  secp256k1_ge ptg_4;
  secp256k1_gej actual;
  secp256k1_gej expected;
  secp256k1_ge pt [32];
  
  bVar28 = 0;
  data.sc = &local_14d8;
  data.pt = pt;
  iVar27 = 0;
  iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,(secp256k1_scalar *)0x0,
                          ecmult_multi_callback,&data,0);
  if (iVar6 == 0) {
    pcVar22 = 
    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0)"
    ;
    uVar13 = 0x120d;
  }
  else {
    for (; iVar27 < COUNT; iVar27 = iVar27 + 1) {
      testutil_random_scalar_order(&local_14d8);
      testutil_random_scalar_order(&local_14b8);
      testutil_random_ge_test(&ptg);
      secp256k1_gej_set_ge(&ptgj,&ptg);
      lVar10 = 0xd;
      psVar18 = &ptg;
      psVar20 = pt;
      for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
        (psVar20->x).n[0] = (psVar18->x).n[0];
        psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
        psVar20 = (secp256k1_ge *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
      }
      psVar18 = &secp256k1_ge_const_g;
      psVar20 = pt + 1;
      for (; lVar10 != 0; lVar10 = lVar10 + -1) {
        (psVar20->x).n[0] = (psVar18->x).n[0];
        psVar18 = (secp256k1_ge *)((long)psVar18 + ((ulong)bVar28 * -2 + 1) * 8);
        psVar20 = (secp256k1_ge *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
      }
      secp256k1_ecmult(&r2,&ptgj,&secp256k1_scalar_zero,&local_14d8);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&local_14d8,ecmult_multi_callback,
                              &data,0);
      if (iVar6 == 0) {
        pcVar22 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0)"
        ;
        uVar13 = 0x121d;
        goto LAB_00138a67;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar22 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar13 = 0x121e;
        goto LAB_00138a67;
      }
      secp256k1_ecmult(&r2,&ptgj,&local_14d8,&secp256k1_scalar_zero);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&data,1);
      if (iVar6 == 0) {
        pcVar22 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1)"
        ;
        uVar13 = 0x1222;
        goto LAB_00138a67;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar22 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar13 = 0x1223;
        goto LAB_00138a67;
      }
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_false_callback,&data,1);
      if (iVar6 != 0) {
        pcVar22 = 
        "test condition failed: !ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1)"
        ;
        uVar13 = 0x1226;
        goto LAB_00138a67;
      }
      secp256k1_ecmult(&r2,&ptgj,&local_14d8,&local_14b8);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&data,2);
      if (iVar6 == 0) {
        pcVar22 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2)"
        ;
        uVar13 = 0x122a;
        goto LAB_00138a67;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar22 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar13 = 0x122b;
        goto LAB_00138a67;
      }
      secp256k1_ecmult(&r2,&ptgj,&local_14d8,&local_14b8);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&local_14b8,ecmult_multi_callback,
                              &data,1);
      if (iVar6 == 0) {
        pcVar22 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1)"
        ;
        uVar13 = 0x122f;
        goto LAB_00138a67;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar22 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar13 = 0x1230;
        goto LAB_00138a67;
      }
    }
    lVar10 = 0xd;
    for (iVar6 = 0; iVar6 < COUNT; iVar6 = iVar6 + 1) {
      lVar9 = 0;
      while (lVar9 != 3) {
        psVar18 = pt;
        for (lVar23 = 0; lVar23 != 0x400; lVar23 = lVar23 + 0x20) {
          testutil_random_scalar_order((secp256k1_scalar *)((long)local_14d8.d + lVar23));
          secp256k1_ge_set_infinity(psVar18);
          psVar18 = psVar18 + 1;
        }
        iVar27 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,(&DAT_0015f130)[lVar9]);
        if (iVar27 == 0) {
          pcVar22 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar13 = 0x123e;
          goto LAB_00138a67;
        }
        iVar27 = secp256k1_gej_is_infinity(&r);
        lVar9 = lVar9 + 1;
        if (iVar27 == 0) {
          pcVar22 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar13 = 0x123f;
          goto LAB_00138a67;
        }
      }
      lVar9 = 0;
      while (lVar9 != 3) {
        psVar25 = &local_14d8;
        for (lVar23 = 0; lVar23 != 0xd00; lVar23 = lVar23 + 0x68) {
          testutil_random_ge_test((secp256k1_ge *)&ptgj);
          psVar17 = &ptgj;
          puVar21 = (uint64_t *)((long)pt[0].x.n + lVar23);
          for (lVar11 = lVar10; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar21 = (psVar17->x).n[0];
            psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar28 * -0x10 + 8);
            puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
          }
          secp256k1_scalar_set_int(psVar25,0);
          psVar25 = psVar25 + 1;
        }
        iVar27 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,(&DAT_0015f130)[lVar9]);
        if (iVar27 == 0) {
          pcVar22 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar13 = 0x1248;
          goto LAB_00138a67;
        }
        iVar27 = secp256k1_gej_is_infinity(&r);
        lVar9 = lVar9 + 1;
        if (iVar27 == 0) {
          pcVar22 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar13 = 0x1249;
          goto LAB_00138a67;
        }
      }
      lVar9 = 0;
      while (testutil_random_ge_test((secp256k1_ge *)&ptgj), lVar9 != 3) {
        psVar25 = &local_14d8;
        for (lVar23 = 0x68; lVar23 != 0xd68; lVar23 = lVar23 + 0xd0) {
          testutil_random_scalar_order(psVar25);
          secp256k1_scalar_negate(psVar25 + 1,psVar25);
          puVar21 = (uint64_t *)((long)pt[0].x.n + lVar23);
          psVar17 = &ptgj;
          puVar19 = (uint64_t *)((long)expected.y.n + lVar23);
          for (lVar11 = lVar10; lVar12 = lVar10, psVar16 = &ptgj, lVar11 != 0; lVar11 = lVar11 + -1)
          {
            *puVar19 = (psVar17->x).n[0];
            psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar28 * -0x10 + 8);
            puVar19 = puVar19 + (ulong)bVar28 * -2 + 1;
          }
          for (; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar21 = (psVar16->x).n[0];
            psVar16 = (secp256k1_gej *)((long)psVar16 + (ulong)bVar28 * -0x10 + 8);
            puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
          }
          psVar25 = psVar25 + 2;
        }
        sVar2 = (&DAT_0015f130)[lVar9];
        iVar27 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,sVar2);
        if (iVar27 == 0) {
          pcVar22 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar13 = 0x1255;
          goto LAB_00138a67;
        }
        iVar27 = secp256k1_gej_is_infinity(&r);
        if (iVar27 == 0) {
          pcVar22 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar13 = 0x1256;
          goto LAB_00138a67;
        }
        testutil_random_scalar_order(&local_14d8);
        psVar18 = pt;
        for (lVar23 = 0x20; lVar23 != 0x420; lVar23 = lVar23 + 0x40) {
          testutil_random_ge_test((secp256k1_ge *)&ptgj);
          uVar4 = local_14d8.d[3];
          uVar3 = local_14d8.d[1];
          *(uint64_t *)((long)t0.d + lVar23 + 0x10) = local_14d8.d[2];
          *(uint64_t *)((long)t0.d + lVar23 + 0x18) = uVar4;
          *(uint64_t *)((long)t0.d + lVar23) = local_14d8.d[0];
          *(uint64_t *)((long)t0.d + lVar23 + 8) = uVar3;
          *(uint64_t *)((long)local_14d8.d + lVar23) = local_14d8.d[0];
          *(uint64_t *)((long)local_14d8.d + lVar23 + 8) = local_14d8.d[1];
          *(uint64_t *)((long)local_14d8.d + lVar23 + 0x10) = local_14d8.d[2];
          *(uint64_t *)((long)local_14d8.d + lVar23 + 0x18) = local_14d8.d[3];
          psVar17 = &ptgj;
          psVar20 = psVar18;
          for (lVar11 = lVar10; lVar11 != 0; lVar11 = lVar11 + -1) {
            (psVar20->x).n[0] = (psVar17->x).n[0];
            psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar28 * -0x10 + 8);
            psVar20 = (secp256k1_ge *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
          }
          secp256k1_ge_neg(psVar18 + 1,psVar18);
          psVar18 = psVar18 + 2;
        }
        iVar27 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,sVar2);
        if (iVar27 == 0) {
          pcVar22 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar13 = 0x1262;
          goto LAB_00138a67;
        }
        iVar27 = secp256k1_gej_is_infinity(&r);
        lVar9 = lVar9 + 1;
        if (iVar27 == 0) {
          pcVar22 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar13 = 0x1263;
          goto LAB_00138a67;
        }
      }
      secp256k1_scalar_set_int(&local_14d8,0);
      psVar17 = &ptgj;
      psVar18 = pt;
      for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
        (psVar18->x).n[0] = (psVar17->x).n[0];
        psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar28 * -0x10 + 8);
        psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
      }
      psVar25 = &local_14b8;
      for (lVar9 = 0x68; lVar9 != 0xd00; lVar9 = lVar9 + 0x68) {
        psVar17 = &ptgj;
        puVar21 = (uint64_t *)((long)pt[0].x.n + lVar9);
        for (lVar23 = lVar10; lVar23 != 0; lVar23 = lVar23 + -1) {
          *puVar21 = (psVar17->x).n[0];
          psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar28 * -0x10 + 8);
          puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
        }
        testutil_random_scalar_order(psVar25);
        secp256k1_scalar_add(&local_14d8,&local_14d8,psVar25);
        secp256k1_scalar_negate(psVar25,psVar25);
        psVar25 = psVar25 + 1;
      }
      iVar27 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                               ecmult_multi_callback,&data,0x20);
      if (iVar27 == 0) {
        pcVar22 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32)"
        ;
        uVar13 = 0x1271;
        goto LAB_00138a67;
      }
      iVar27 = secp256k1_gej_is_infinity(&r);
      if (iVar27 == 0) {
        pcVar22 = "test condition failed: secp256k1_gej_is_infinity(&r)";
        uVar13 = 0x1272;
        goto LAB_00138a67;
      }
    }
    iVar6 = 0;
    do {
      if (COUNT <= iVar6) {
        iVar6 = 0;
        goto LAB_0013843e;
      }
      secp256k1_gej_set_infinity(&r);
      testutil_random_scalar_order(&local_14d8);
      psVar18 = pt;
      for (lVar10 = 0; uVar5 = local_14d8.d[3], uVar4 = local_14d8.d[2], uVar3 = local_14d8.d[1],
          lVar10 != 0x280; lVar10 = lVar10 + 0x20) {
        *(uint64_t *)((long)local_14d8.d + lVar10) = local_14d8.d[0];
        *(uint64_t *)((long)local_14d8.d + lVar10 + 8) = uVar3;
        *(uint64_t *)((long)local_14d8.d + lVar10 + 0x10) = uVar4;
        *(uint64_t *)((long)local_14d8.d + lVar10 + 0x18) = uVar5;
        testutil_random_ge_test((secp256k1_ge *)&ptgj);
        psVar17 = &ptgj;
        psVar20 = psVar18;
        for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
          (psVar20->x).n[0] = (psVar17->x).n[0];
          psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar28 * -0x10 + 8);
          psVar20 = (secp256k1_ge *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
        }
        secp256k1_gej_add_ge_var(&r,&r,psVar18,(secp256k1_fe *)0x0);
        psVar18 = psVar18 + 1;
      }
      secp256k1_ecmult(&r2,&r,&local_14d8,&secp256k1_scalar_zero);
      iVar27 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                               ecmult_multi_callback,&data,0x14);
      if (iVar27 == 0) {
        pcVar22 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
        ;
        uVar13 = 0x1284;
        goto LAB_00138a67;
      }
      iVar27 = secp256k1_gej_eq_var(&r,&r2);
      iVar6 = iVar6 + 1;
    } while (iVar27 != 0);
    pcVar22 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
    uVar13 = 0x1285;
  }
LAB_00138a67:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar13,pcVar22);
  abort();
LAB_0013843e:
  if (COUNT <= iVar6) goto LAB_0013853e;
  secp256k1_scalar_set_int(&rs,0);
  testutil_random_ge_test(&ptg);
  psVar25 = &local_14d8;
  for (lVar10 = 0; lVar10 != 0x820; lVar10 = lVar10 + 0x68) {
    testutil_random_scalar_order(psVar25);
    psVar18 = &ptg;
    puVar21 = (uint64_t *)((long)pt[0].x.n + lVar10);
    for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar21 = (psVar18->x).n[0];
      psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
      puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
    }
    secp256k1_scalar_add(&rs,&rs,psVar25);
    psVar25 = psVar25 + 1;
  }
  secp256k1_gej_set_ge(&ptgj,pt);
  secp256k1_ecmult(&r2,&ptgj,&rs,&secp256k1_scalar_zero);
  iVar27 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                           ecmult_multi_callback,&data,0x14);
  if (iVar27 == 0) {
    pcVar22 = 
    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
    ;
    uVar13 = 0x1299;
    goto LAB_00138a67;
  }
  iVar27 = secp256k1_gej_eq_var(&r,&r2);
  if (iVar27 == 0) {
    pcVar22 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
    uVar13 = 0x129a;
    goto LAB_00138a67;
  }
  iVar6 = iVar6 + 1;
  goto LAB_0013843e;
LAB_0013853e:
  psVar18 = pt;
  for (lVar10 = 0; lVar10 != 0x280; lVar10 = lVar10 + 0x20) {
    testutil_random_scalar_order((secp256k1_scalar *)((long)local_14d8.d + lVar10));
    testutil_random_ge_test(psVar18);
    psVar18 = psVar18 + 1;
  }
  local_14d8.d[2] = 0;
  local_14d8.d[3] = 0;
  local_14d8.d[0] = 0;
  local_14d8.d[1] = 0;
  iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                          ecmult_multi_callback,&data,0x14);
  if (iVar6 == 0) {
    pcVar22 = 
    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
    ;
    uVar13 = 0x12a4;
  }
  else {
    local_1448 = 0;
    uStack_1440 = 0;
    local_1458 = 0;
    uStack_1450 = 0;
    local_1468 = 0;
    uStack_1460 = 0;
    local_1478 = 0;
    uStack_1470 = 0;
    local_1488 = 0;
    uStack_1480 = 0;
    local_1498 = 0;
    uStack_1490 = 0;
    local_14b8.d[2] = 0;
    local_14b8.d[3] = 0;
    local_14b8.d[0] = 0;
    local_14b8.d[1] = 0;
    iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                            ecmult_multi_callback,&data,6);
    if (iVar6 == 0) {
      pcVar22 = 
      "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6)"
      ;
      uVar13 = 0x12a9;
    }
    else {
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&data,5);
      if (iVar6 == 0) {
        pcVar22 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5)"
        ;
        uVar13 = 0x12aa;
      }
      else {
        iVar6 = secp256k1_gej_is_infinity(&r);
        if (iVar6 != 0) {
          testutil_random_ge_test(&ptg_4);
          secp256k1_gej_set_ge(&ptgj,&ptg_4);
          uVar8 = 0;
          do {
            if (uVar8 == 8) {
              return;
            }
            uVar1 = uVar8 + 1;
            uVar7 = (uint)uVar8;
            uVar14 = 0;
            while (uVar8 = uVar1, uVar14 != 8) {
              secp256k1_scalar_set_int(&t0,(uint)(uVar1 >> 1));
              secp256k1_scalar_cond_negate(&t0,uVar7 & 1);
              uVar8 = uVar14 + 1;
              secp256k1_scalar_set_int(&t1,(uint)(uVar8 >> 1));
              secp256k1_scalar_cond_negate(&t1,(uint)uVar14 & 1);
              secp256k1_ecmult((secp256k1_gej *)&ptg,&ptgj,&t0,&secp256k1_scalar_zero);
              secp256k1_ecmult((secp256k1_gej *)&rs,&ptgj,&t1,&secp256k1_scalar_zero);
              uVar26 = 0;
              while (uVar14 = uVar8, uVar26 != 8) {
                uVar14 = uVar26 + 1;
                uVar24 = (uint)uVar26;
                uVar15 = 0;
                while (uVar26 = uVar14, uVar15 != 8) {
                  secp256k1_ge_set_gej(pt,(secp256k1_gej *)&ptg);
                  secp256k1_ge_set_gej(pt + 1,(secp256k1_gej *)&rs);
                  secp256k1_scalar_set_int(&local_14d8,(uint)(uVar14 >> 1));
                  secp256k1_scalar_cond_negate(&local_14d8,uVar24 & 1);
                  secp256k1_scalar_set_int(&local_14b8,(uint)(uVar15 + 1 >> 1));
                  secp256k1_scalar_cond_negate(&local_14b8,(uint)uVar15 & 1);
                  secp256k1_scalar_mul(&tmp1,&t0,&local_14d8);
                  secp256k1_scalar_mul(&tmp2,&t1,&local_14b8);
                  secp256k1_scalar_add(&tmp1,&tmp1,&tmp2);
                  secp256k1_ecmult(&expected,&ptgj,&tmp1,&secp256k1_scalar_zero);
                  iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&actual,
                                          &secp256k1_scalar_zero,ecmult_multi_callback,&data,2);
                  if (iVar6 == 0) {
                    pcVar22 = 
                    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2)"
                    ;
                    uVar13 = 0x12d7;
                    goto LAB_00138a67;
                  }
                  iVar6 = secp256k1_gej_eq_var(&actual,&expected);
                  uVar15 = uVar15 + 1;
                  if (iVar6 == 0) {
                    pcVar22 = "test condition failed: secp256k1_gej_eq_var(&actual, &expected)";
                    uVar13 = 0x12d8;
                    goto LAB_00138a67;
                  }
                }
              }
            }
          } while( true );
        }
        pcVar22 = "test condition failed: secp256k1_gej_is_infinity(&r)";
        uVar13 = 0x12ab;
      }
    }
  }
  goto LAB_00138a67;
}

Assistant:

static void test_ecmult_multi(secp256k1_scratch *scratch, secp256k1_ecmult_multi_func ecmult_multi) {
    int ncount;
    secp256k1_scalar sc[32];
    secp256k1_ge pt[32];
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;

    data.sc = sc;
    data.pt = pt;

    /* No points to multiply */
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0));

    /* Check 1- and 2-point multiplies against ecmult */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        testutil_random_scalar_order(&sc[0]);
        testutil_random_scalar_order(&sc[1]);

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[0] = ptg;
        pt[1] = secp256k1_ge_const_g;

        /* only G scalar */
        secp256k1_ecmult(&r2, &ptgj, &secp256k1_scalar_zero, &sc[0]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 1-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* Try to multiply 1 point, but callback returns false */
        CHECK(!ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1));

        /* 2-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 2-point with G scalar */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check infinite outputs of various forms */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        size_t i, j;
        size_t sizes[] = { 2, 10, 32 };

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_scalar_order(&sc[i]);
                secp256k1_ge_set_infinity(&pt[i]);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_ge_test(&ptg);
                pt[i] = ptg;
                secp256k1_scalar_set_int(&sc[i], 0);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            testutil_random_ge_test(&ptg);
            for (i = 0; i < 16; i++) {
                testutil_random_scalar_order(&sc[2*i]);
                secp256k1_scalar_negate(&sc[2*i + 1], &sc[2*i]);
                pt[2 * i] = ptg;
                pt[2 * i + 1] = ptg;
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));

            testutil_random_scalar_order(&sc[0]);
            for (i = 0; i < 16; i++) {
                testutil_random_ge_test(&ptg);

                sc[2*i] = sc[0];
                sc[2*i+1] = sc[0];
                pt[2 * i] = ptg;
                secp256k1_ge_neg(&pt[2*i+1], &pt[2*i]);
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        testutil_random_ge_test(&ptg);
        secp256k1_scalar_set_int(&sc[0], 0);
        pt[0] = ptg;
        for (i = 1; i < 32; i++) {
            pt[i] = ptg;

            testutil_random_scalar_order(&sc[i]);
            secp256k1_scalar_add(&sc[0], &sc[0], &sc[i]);
            secp256k1_scalar_negate(&sc[i], &sc[i]);
        }

        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32));
        CHECK(secp256k1_gej_is_infinity(&r));
    }

    /* Check random points, constant scalar */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_gej_set_infinity(&r);

        testutil_random_scalar_order(&sc[0]);
        for (i = 0; i < 20; i++) {
            secp256k1_ge ptg;
            sc[i] = sc[0];
            testutil_random_ge_test(&ptg);
            pt[i] = ptg;
            secp256k1_gej_add_ge_var(&r, &r, &pt[i], NULL);
        }

        secp256k1_ecmult(&r2, &r, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check random scalars, constant point */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_ge ptg;
        secp256k1_gej p0j;
        secp256k1_scalar rs;
        secp256k1_scalar_set_int(&rs, 0);

        testutil_random_ge_test(&ptg);
        for (i = 0; i < 20; i++) {
            testutil_random_scalar_order(&sc[i]);
            pt[i] = ptg;
            secp256k1_scalar_add(&rs, &rs, &sc[i]);
        }

        secp256k1_gej_set_ge(&p0j, &pt[0]);
        secp256k1_ecmult(&r2, &p0j, &rs, &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Sanity check that zero scalars don't cause problems */
    for (ncount = 0; ncount < 20; ncount++) {
        testutil_random_scalar_order(&sc[ncount]);
        testutil_random_ge_test(&pt[ncount]);
    }

    secp256k1_scalar_clear(&sc[0]);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
    secp256k1_scalar_clear(&sc[1]);
    secp256k1_scalar_clear(&sc[2]);
    secp256k1_scalar_clear(&sc[3]);
    secp256k1_scalar_clear(&sc[4]);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6));
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5));
    CHECK(secp256k1_gej_is_infinity(&r));

    /* Run through s0*(t0*P) + s1*(t1*P) exhaustively for many small values of s0, s1, t0, t1 */
    {
        const size_t TOP = 8;
        size_t s0i, s1i;
        size_t t0i, t1i;
        secp256k1_ge ptg;
        secp256k1_gej ptgj;

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);

        for(t0i = 0; t0i < TOP; t0i++) {
            for(t1i = 0; t1i < TOP; t1i++) {
                secp256k1_gej t0p, t1p;
                secp256k1_scalar t0, t1;

                secp256k1_scalar_set_int(&t0, (t0i + 1) / 2);
                secp256k1_scalar_cond_negate(&t0, t0i & 1);
                secp256k1_scalar_set_int(&t1, (t1i + 1) / 2);
                secp256k1_scalar_cond_negate(&t1, t1i & 1);

                secp256k1_ecmult(&t0p, &ptgj, &t0, &secp256k1_scalar_zero);
                secp256k1_ecmult(&t1p, &ptgj, &t1, &secp256k1_scalar_zero);

                for(s0i = 0; s0i < TOP; s0i++) {
                    for(s1i = 0; s1i < TOP; s1i++) {
                        secp256k1_scalar tmp1, tmp2;
                        secp256k1_gej expected, actual;

                        secp256k1_ge_set_gej(&pt[0], &t0p);
                        secp256k1_ge_set_gej(&pt[1], &t1p);

                        secp256k1_scalar_set_int(&sc[0], (s0i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[0], s0i & 1);
                        secp256k1_scalar_set_int(&sc[1], (s1i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[1], s1i & 1);

                        secp256k1_scalar_mul(&tmp1, &t0, &sc[0]);
                        secp256k1_scalar_mul(&tmp2, &t1, &sc[1]);
                        secp256k1_scalar_add(&tmp1, &tmp1, &tmp2);

                        secp256k1_ecmult(&expected, &ptgj, &tmp1, &secp256k1_scalar_zero);
                        CHECK(ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
                        CHECK(secp256k1_gej_eq_var(&actual, &expected));
                    }
                }
            }
        }
    }
}